

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

void __thiscall procxx::process::exec(process *this)

{
  pipe_t *ppVar1;
  process *ppVar2;
  pointer pbVar3;
  __pid_t _Var4;
  pipe_end pVar5;
  ssize_t sVar6;
  exception *peVar7;
  long *plVar8;
  int *piVar9;
  undefined8 extraout_RAX;
  size_t in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  int __fd;
  char *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar10;
  pipe_t *ppVar11;
  pipe_t err_pipe;
  char err [4];
  vector<char_*,_std::allocator<char_*>_> args;
  char err_1 [4];
  undefined4 uStack_4c;
  
  if (this->pid_ != -1) {
    peVar7 = (exception *)__cxa_allocate_exception(0x10);
    exception::runtime_error(peVar7,"process already started");
    __cxa_throw(peVar7,&exception::typeinfo,std::runtime_error::~runtime_error);
  }
  pipe_t::pipe_t(&err_pipe);
  _Var4 = fork();
  if (_Var4 == -1) {
    perror("fork()");
    peVar7 = (exception *)__cxa_allocate_exception(0x10);
    exception::runtime_error(peVar7,"Failed to fork child process");
    __cxa_throw(peVar7,&exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var4 == 0) {
    pVar5 = pipe_t::read_end();
    pipe_t::close(&err_pipe,pVar5.end_);
    pVar5 = pipe_t::write_end();
    ppVar11 = &(this->pipe_buf_).stdin_pipe_;
    pipe_t::close(ppVar11,pVar5.end_);
    pVar5 = pipe_t::read_end();
    ppVar1 = &(this->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_;
    pipe_t::close(ppVar1,pVar5.end_);
    pVar5 = pipe_t::write_end();
    pipe_t::dup(ppVar1,pVar5.end_);
    pVar5 = pipe_t::read_end();
    ppVar1 = &(this->err_buf_).stdout_pipe_;
    pipe_t::close(ppVar1,pVar5.end_);
    pVar5 = pipe_t::write_end();
    pipe_t::dup(ppVar1,pVar5.end_);
    if (this->read_from_ == (process *)0x0) {
      pVar5 = pipe_t::read_end();
    }
    else {
      recursive_close_stdin(this->read_from_);
      pVar5 = pipe_t::read_end();
      pipe_t::close(ppVar11,pVar5.end_);
      ppVar2 = this->read_from_;
      pVar5 = pipe_t::read_end();
      ppVar11 = &(ppVar2->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_;
    }
    pipe_t::dup(ppVar11,pVar5.end_);
    args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<char_*,_std::allocator<char_*>_>::reserve
              (&args,((long)(this->args_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->args_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    pbVar3 = (this->args_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar10 = (this->args_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar3;
        pbVar10 = pbVar10 + 1) {
      _err_1 = (pbVar10->_M_dataplus)._M_p;
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)&args,(char **)err_1);
    }
    _err_1 = (char *)0x0;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)&args,(char **)err_1);
    limits_t::set_limits(&this->limits_);
    execvp(*args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
            ._M_start,
           args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
           _M_start);
    piVar9 = __errno_location();
    err_1 = (char  [4])*piVar9;
    __fd = (int)err_1;
    pipe_t::write(&err_pipe,__fd,(void *)0x4,in_RCX);
    pipe_t::close(&err_pipe,__fd);
    _Exit(1);
    std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
              (&args.super__Vector_base<char_*,_std::allocator<char_*>_>);
    pipe_t::~pipe_t(&err_pipe);
    _Unwind_Resume(extraout_RAX);
  }
  pVar5 = pipe_t::write_end();
  pipe_t::close(&err_pipe,pVar5.end_);
  pVar5 = pipe_t::write_end();
  pipe_t::close(&(this->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_,pVar5.end_);
  pVar5 = pipe_t::write_end();
  pipe_t::close(&(this->err_buf_).stdout_pipe_,pVar5.end_);
  pVar5 = pipe_t::read_end();
  ppVar11 = &(this->pipe_buf_).stdin_pipe_;
  pipe_t::close(ppVar11,pVar5.end_);
  if (this->read_from_ != (process *)0x0) {
    pVar5 = pipe_t::write_end();
    pipe_t::close(ppVar11,pVar5.end_);
    ppVar2 = this->read_from_;
    pVar5 = pipe_t::read_end();
    pipe_t::close(&(ppVar2->pipe_buf_).super_pipe_ostreambuf.stdout_pipe_,pVar5.end_);
    ppVar2 = this->read_from_;
    pVar5 = pipe_t::read_end();
    pipe_t::close(&(ppVar2->err_buf_).stdout_pipe_,pVar5.end_);
  }
  this->pid_ = _Var4;
  __buf = err;
  sVar6 = read(err_pipe.pipe_._M_elems[0],__buf,4);
  if (sVar6 != 4) {
    pipe_t::close(&err_pipe,(int)__buf);
    pipe_t::~pipe_t(&err_pipe);
    return;
  }
  peVar7 = (exception *)__cxa_allocate_exception(0x10);
  plVar8 = (long *)std::_V2::system_category();
  (**(code **)(*plVar8 + 0x20))(err_1,plVar8,err);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 "Failed to exec process: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_1);
  exception::runtime_error(peVar7,(string *)&args);
  __cxa_throw(peVar7,&exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void exec() {
    if (pid_ != -1)
      throw exception{"process already started"};

    pipe_t err_pipe;

    auto pid = fork();
    if (pid == -1) {
      perror("fork()");
      throw exception{"Failed to fork child process"};
    } else if (pid == 0) {
      err_pipe.close(pipe_t::read_end());
      pipe_buf_.stdin_pipe().close(pipe_t::write_end());
      pipe_buf_.stdout_pipe().close(pipe_t::read_end());
      pipe_buf_.stdout_pipe().dup(pipe_t::write_end(), STDOUT_FILENO);
      err_buf_.stdout_pipe().close(pipe_t::read_end());
      err_buf_.stdout_pipe().dup(pipe_t::write_end(), STDERR_FILENO);

      if (read_from_) {
        read_from_->recursive_close_stdin();
        pipe_buf_.stdin_pipe().close(pipe_t::read_end());
        read_from_->pipe_buf_.stdout_pipe().dup(pipe_t::read_end(),
                                                STDIN_FILENO);
      } else {
        pipe_buf_.stdin_pipe().dup(pipe_t::read_end(), STDIN_FILENO);
      }

      std::vector<char*> args;
      args.reserve(args_.size() + 1);
      for (auto& arg : args_)
        args.push_back(const_cast<char*>(arg.c_str()));
      args.push_back(nullptr);

      limits_.set_limits();
      execvp(args[0], args.data());

      char err[sizeof(int)];
      std::memcpy(err, &errno, sizeof(int));
      err_pipe.write(err, sizeof(int));
      err_pipe.close();
      std::_Exit(EXIT_FAILURE);
    } else {
      err_pipe.close(pipe_t::write_end());
      pipe_buf_.stdout_pipe().close(pipe_t::write_end());
      err_buf_.stdout_pipe().close(pipe_t::write_end());
      pipe_buf_.stdin_pipe().close(pipe_t::read_end());
      if (read_from_) {
        pipe_buf_.stdin_pipe().close(pipe_t::write_end());
        read_from_->pipe_buf_.stdout_pipe().close(pipe_t::read_end());
        read_from_->err_buf_.stdout_pipe().close(pipe_t::read_end());
      }
      pid_ = pid;

      char err[sizeof(int)];
      auto bytes = err_pipe.read(err, sizeof(int));
      if (bytes == sizeof(int)) {
        int ec = 0;
        std::memcpy(&ec, err, sizeof(int));
        throw exception{"Failed to exec process: " +
                        std::system_category().message(ec)};
      } else {
        err_pipe.close();
      }
    }
  }